

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lha_parse_linkname(archive_wstring *linkname,archive_wstring *pathname)

{
  wchar_t *pwVar1;
  size_t sVar2;
  
  pwVar1 = wcschr(pathname->s,L'|');
  if (pwVar1 != (wchar_t *)0x0) {
    sVar2 = wcslen(pwVar1 + 1);
    linkname->length = 0;
    archive_wstrncat(linkname,pwVar1 + 1,sVar2);
    *pwVar1 = L'\0';
    sVar2 = wcslen(pathname->s);
    pathname->length = sVar2;
  }
  return (uint)(pwVar1 != (wchar_t *)0x0);
}

Assistant:

static int
lha_parse_linkname(struct archive_wstring *linkname,
    struct archive_wstring *pathname)
{
	wchar_t *	linkptr;
	size_t 	symlen;

	linkptr = wcschr(pathname->s, L'|');
	if (linkptr != NULL) {
		symlen = wcslen(linkptr + 1);
		archive_wstrncpy(linkname, linkptr+1, symlen);

		*linkptr = 0;
		pathname->length = wcslen(pathname->s);

		return (1);
	}
	return (0);
}